

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_memory_events.cpp
# Opt level: O2

void kokkosp_allocate_data(SpaceHandle space,char *label,void *ptr,uint64_t size)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  undefined1 *__s1;
  uint space_;
  ulong uVar4;
  ulong uVar5;
  double time_;
  undefined1 auStack_150 [288];
  
  std::mutex::lock((mutex *)KokkosTools::MemoryEvents::m);
  time_ = Kokkos::Timer::seconds((Timer *)&KokkosTools::MemoryEvents::timer);
  uVar1 = KokkosTools::MemoryEvents::num_spaces;
  lVar3 = (long)(int)KokkosTools::MemoryEvents::num_spaces;
  uVar5 = 0;
  uVar4 = 0;
  if (0 < (int)KokkosTools::MemoryEvents::num_spaces) {
    uVar4 = (ulong)KokkosTools::MemoryEvents::num_spaces;
  }
  __s1 = KokkosTools::MemoryEvents::space_name;
  space_ = KokkosTools::MemoryEvents::num_spaces;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    iVar2 = strcmp(__s1,space.name);
    if (iVar2 == 0) {
      space_ = (uint)uVar5;
    }
    __s1 = __s1 + 0x40;
  }
  if (space_ == uVar1) {
    strncpy(KokkosTools::MemoryEvents::space_name + lVar3 * 0x40,space.name,0x40);
    KokkosTools::MemoryEvents::num_spaces = uVar1 + 1;
  }
  lVar3 = (long)(int)space_;
  (&KokkosTools::MemoryEvents::space_size)[lVar3] =
       (&KokkosTools::MemoryEvents::space_size)[lVar3] + size;
  auStack_150._0_8_ = KokkosTools::MemoryEvents::max_mem_usage();
  auStack_150._8_8_ = (&KokkosTools::MemoryEvents::space_size)[lVar3];
  auStack_150._16_8_ = time_;
  std::
  vector<std::tuple<double,unsigned_long,double>,std::allocator<std::tuple<double,unsigned_long,double>>>
  ::emplace_back<std::tuple<double,unsigned_long,double>>
            ((vector<std::tuple<double,unsigned_long,double>,std::allocator<std::tuple<double,unsigned_long,double>>>
              *)(KokkosTools::MemoryEvents::space_size_track + lVar3 * 0x18),
             (tuple<double,_unsigned_long,_double> *)auStack_150);
  KokkosTools::MemoryEvents::EventRecord::EventRecord
            ((EventRecord *)auStack_150,ptr,size,1,space_,time_,label);
  std::
  vector<KokkosTools::MemoryEvents::EventRecord,_std::allocator<KokkosTools::MemoryEvents::EventRecord>_>
  ::emplace_back<KokkosTools::MemoryEvents::EventRecord>
            ((vector<KokkosTools::MemoryEvents::EventRecord,_std::allocator<KokkosTools::MemoryEvents::EventRecord>_>
              *)&KokkosTools::MemoryEvents::events,(EventRecord *)auStack_150);
  pthread_mutex_unlock((pthread_mutex_t *)KokkosTools::MemoryEvents::m);
  return;
}

Assistant:

void kokkosp_allocate_data(const SpaceHandle space, const char* label,
                           const void* const ptr, const uint64_t size) {
  std::lock_guard<std::mutex> lock(m);

  double time = timer.seconds();

  int space_i = num_spaces;
  for (int s = 0; s < num_spaces; s++)
    if (strcmp(space_name[s], space.name) == 0) space_i = s;

  if (space_i == num_spaces) {
    strncpy(space_name[num_spaces], space.name, 64);
    num_spaces++;
  }
  space_size[space_i] += size;
  space_size_track[space_i].push_back(
      std::make_tuple(time, space_size[space_i], max_mem_usage()));

  events.push_back(
      EventRecord(ptr, size, MEMOP_ALLOCATE, space_i, time, label));
}